

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void __thiscall MetaSim::Event::Event(Event *this,Event *e)

{
  bool bVar1;
  pointer pPVar2;
  long in_RSI;
  undefined8 *in_RDI;
  unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_> *p;
  const_iterator __end1;
  const_iterator __begin1;
  deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  *__range1;
  _Self *in_stack_ffffffffffffff78;
  _Self *__x;
  _Deque_iterator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_const_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_&,_const_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_*>
  local_48;
  long local_28;
  long local_10;
  
  *in_RDI = &PTR__Event_001658e0;
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  __x = (_Self *)(in_RDI + 3);
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  local_10 = in_RSI;
  std::
  deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ::deque((deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           *)0x143e4f);
  Tick::Tick((Tick *)(in_RDI + 0xd),0x7fffffffffffffff);
  Tick::Tick((Tick *)(in_RDI + 0xe),0x7fffffffffffffff);
  *(undefined4 *)(in_RDI + 0xf) = *(undefined4 *)(local_10 + 0x78);
  *(undefined4 *)((long)in_RDI + 0x7c) = *(undefined4 *)(local_10 + 0x7c);
  *(byte *)(in_RDI + 0x10) = *(byte *)(local_10 + 0x80) & 1;
  local_28 = local_10 + 0x18;
  std::
  deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ::begin((deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           *)in_stack_ffffffffffffff78);
  std::
  deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ::end((deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
         *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(__x,in_stack_ffffffffffffff78);
    if (!bVar1) break;
    std::
    _Deque_iterator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_const_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_&,_const_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_*>
    ::operator*(&local_48);
    pPVar2 = std::
             unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
             ::operator->((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
                           *)0x143f0c);
    (*pPVar2->_vptr_ParticleInterface[3])(pPVar2,in_RDI);
    std::
    _Deque_iterator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_const_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_&,_const_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_*>
    ::operator++(__x);
  }
  return;
}

Assistant:

Event::Event(const Event &e) :
        _order(0),
        _isInQueue(false),
        _particles(),
        _time(MAXTICK),
        _lastTime(MAXTICK),
        _priority(e._priority),
        _std_priority(e._std_priority),
        _disposable(e._disposable)
    {
        for (auto &p : e._particles) 
            p->clone_to(*this);
    }